

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>_>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
  *this_00;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar7;
  FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_> *pFVar8;
  value_type vVar9;
  double dVar10;
  
  this_00 = &this->right_->fadexpr_;
  dVar1 = (((this->left_->fadexpr_).right_)->dx_).ptr_to_data[i];
  dVar2 = (this->left_->fadexpr_).left_.constant_;
  dVar3 = ((this_00->left_->fadexpr_).left_)->val_;
  dVar4 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar5 = ((this_00->right_->fadexpr_).left_)->val_;
  dVar6 = ((this_00->right_->fadexpr_).right_)->val_;
  vVar9 = FadBinaryMul<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>_>
          ::fastAccessDx(this_00,i);
  pFVar7 = (this->right_->fadexpr_).left_;
  pFVar8 = (this->right_->fadexpr_).right_;
  dVar10 = (((pFVar8->fadexpr_).left_)->val_ + ((pFVar8->fadexpr_).right_)->val_) *
           (((pFVar7->fadexpr_).left_)->val_ + ((pFVar7->fadexpr_).right_)->val_);
  return ((dVar5 + dVar6) * (dVar3 + dVar4) * dVar1 * dVar2 -
         (this->left_->fadexpr_).left_.constant_ * ((this->left_->fadexpr_).right_)->val_ * vVar9) /
         (dVar10 * dVar10);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}